

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

vector<core::Intersection,_std::allocator<core::Intersection>_> * __thiscall
geometry::primitive::Triangle::local_intersect
          (vector<core::Intersection,_std::allocator<core::Intersection>_> *__return_storage_ptr__,
          Triangle *this,Ray *ray)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pair<double,_double> uv;
  Tuple4d origin_cross_e1;
  Tuple4d p1_to_origin;
  Tuple4d dir_cross_e2;
  Tuple4d local_b0;
  Tuple4d local_90;
  Intersection local_70;
  Tuple4d local_50;
  
  math::cross(&local_50,&ray->m_direction,(Tuple4d *)&this->field_0x120);
  dVar1 = math::dot((Tuple4d *)&this->field_0x100,&local_50);
  (__return_storage_ptr__->
  super__Vector_base<core::Intersection,_std::allocator<core::Intersection>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<core::Intersection,_std::allocator<core::Intersection>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<core::Intersection,_std::allocator<core::Intersection>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1e-05 <= ABS(dVar1)) {
    math::operator-(&local_90,&ray->m_origin,(Tuple4d *)&this->field_0xa0);
    dVar2 = math::dot(&local_90,&local_50);
    dVar1 = 1.0 / dVar1;
    dVar2 = dVar2 * dVar1;
    if ((0.0 <= dVar2) && (dVar2 <= 1.0)) {
      math::cross(&local_b0,&local_90,(Tuple4d *)&this->field_0x100);
      dVar3 = math::dot(&ray->m_direction,&local_b0);
      dVar3 = dVar3 * dVar1;
      if ((0.0 <= dVar3) && (dVar2 + dVar3 <= 1.0)) {
        dVar4 = math::dot((Tuple4d *)&this->field_0x120,&local_b0);
        uv.second = dVar3;
        uv.first = dVar2;
        core::Intersection::Intersection(&local_70,dVar1 * dVar4,&this->super_Primitive,uv);
        std::vector<core::Intersection,_std::allocator<core::Intersection>_>::
        emplace_back<core::Intersection>(__return_storage_ptr__,&local_70);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<core::Intersection> geometry::primitive::Triangle::local_intersect(const core::Ray &ray) const
{
    math::Tuple4d dir_cross_e2 = cross(ray.direction(), m_edges[1]);
    double det = dot(m_edges[0], dir_cross_e2);

    std::vector<core::Intersection> intersects;
    if (std::abs(det) >= constants::EPSILON)
    {
	double f = 1 / det;
	math::Tuple4d p1_to_origin = ray.origin() - m_points[0];
	double u = f * dot(p1_to_origin, dir_cross_e2);
	if (u >= 0 && u <= 1)
	{
	    math::Tuple4d origin_cross_e1 = cross(p1_to_origin, m_edges[0]);
	    double v = f * dot(ray.direction(), origin_cross_e1);
	    if (v >= 0 && (u + v) <= 1)
	    {
		double t = f * dot(m_edges[1], origin_cross_e1);
		intersects.push_back(core::Intersection{t, (Primitive*) this, std::make_pair(u, v)});
	    }
	}
    }
    return intersects;
}